

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_InitFuncScoped
               (FrameDisplay *pScope,PropertyId propertyId,Var newValue,Var defaultInstance,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  int iVar4;
  ThreadContext *threadContext;
  long *plVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  DynamicObject *obj;
  uint local_5c;
  int length;
  int i;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  Var defaultInstance_local;
  Var newValue_local;
  PropertyId propertyId_local;
  FrameDisplay *pScope_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&length,threadContext);
  uVar3 = FrameDisplay::GetLength(pScope);
  local_5c = 0;
  do {
    if ((int)(uint)uVar3 <= (int)local_5c) {
      bVar2 = TaggedNumber::Is(defaultInstance);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xcf9,"(!TaggedNumber::Is(defaultInstance))",
                                    "Root object is an int or tagged float?");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pRVar7 = VarTo<Js::RecyclableObject>(defaultInstance);
      pScope_local._4_4_ =
           (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject[0x20])(pRVar7,(ulong)(uint)propertyId,newValue);
LAB_00f95aac:
      JsReentLock::~JsReentLock((JsReentLock *)&length);
      return pScope_local._4_4_;
    }
    plVar5 = (long *)FrameDisplay::GetItem(pScope,local_5c);
    iVar4 = (**(code **)(*plVar5 + 0x100))(plVar5,propertyId,newValue);
    if (iVar4 != 0) {
      pScope_local._4_4_ = 1;
      goto LAB_00f95aac;
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

BOOL JavascriptOperators::OP_InitFuncScoped(FrameDisplay *pScope, PropertyId propertyId, Var newValue, Var defaultInstance, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_InitFuncScoped, reentrancylock, scriptContext->GetThreadContext());
        int i;
        int length = pScope->GetLength();
        DynamicObject *obj;

        for (i = 0; i < length; i++)
        {
            obj = (DynamicObject*)pScope->GetItem(i);

            if (obj->InitFuncScoped(propertyId, newValue))
            {
                return TRUE;
            }
        }

        AssertMsg(!TaggedNumber::Is(defaultInstance), "Root object is an int or tagged float?");
        return VarTo<RecyclableObject>(defaultInstance)->InitFuncScoped(propertyId, newValue);
        JIT_HELPER_END(Op_InitFuncScoped);
    }